

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# largebuddyrange.h
# Opt level: O3

Arena<void> __thiscall
snmalloc::
LargeBuddyRange<24UL,_63UL,_snmalloc::BasicPagemap<snmalloc::PALLinux,_snmalloc::FlatPagemap<14UL,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_snmalloc::PALLinux,_false>,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_false>,_0UL>
::
Type<snmalloc::GlobalRange::Type<snmalloc::LogRange<2UL>::Type<snmalloc::LargeBuddyRange<24UL,_63UL,_snmalloc::BasicPagemap<snmalloc::PALLinux,_snmalloc::FlatPagemap<14UL,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_snmalloc::PALLinux,_false>,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_false>,_14UL>::Type<snmalloc::PagemapRegisterRange<snmalloc::DummyAuthmap>::Type<snmalloc::PagemapRegisterRange<snmalloc::BasicPagemap<snmalloc::PALLinux,_snmalloc::FlatPagemap<14UL,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_snmalloc::PALLinux,_false>,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_false>_>::Type<snmalloc::PalRange<snmalloc::PALLinux>_>_>_>_>_>_>
::alloc_range(Type<snmalloc::GlobalRange::Type<snmalloc::LogRange<2UL>::Type<snmalloc::LargeBuddyRange<24UL,_63UL,_snmalloc::BasicPagemap<snmalloc::PALLinux,_snmalloc::FlatPagemap<14UL,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_snmalloc::PALLinux,_false>,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_false>,_14UL>::Type<snmalloc::PagemapRegisterRange<snmalloc::DummyAuthmap>::Type<snmalloc::PagemapRegisterRange<snmalloc::BasicPagemap<snmalloc::PALLinux,_snmalloc::FlatPagemap<14UL,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_snmalloc::PALLinux,_false>,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_false>_>::Type<snmalloc::PalRange<snmalloc::PALLinux>_>_>_>_>_>_>
              *this,size_t size)

{
  Arena<void> AVar1;
  CapPtr<void,_snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)2,_(snmalloc::capptr::dimension::AddressSpaceControl)1,_(snmalloc::capptr::dimension::Wildness)1>_>
  CVar2;
  
  if (0x7ffffffffffffffe < size) {
    CVar2 = LockRange::
            Type<snmalloc::LogRange<2UL>::Type<snmalloc::LargeBuddyRange<24UL,_63UL,_snmalloc::BasicPagemap<snmalloc::PALLinux,_snmalloc::FlatPagemap<14UL,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_snmalloc::PALLinux,_false>,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_false>,_14UL>::Type<snmalloc::PagemapRegisterRange<snmalloc::DummyAuthmap>::Type<snmalloc::PagemapRegisterRange<snmalloc::BasicPagemap<snmalloc::PALLinux,_snmalloc::FlatPagemap<14UL,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_snmalloc::PALLinux,_false>,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_false>_>::Type<snmalloc::PalRange<snmalloc::PALLinux>_>_>_>_>_>
            ::alloc_range(&StaticParent<snmalloc::LockRange::Type<snmalloc::LogRange<2UL>::Type<snmalloc::LargeBuddyRange<24UL,_63UL,_snmalloc::BasicPagemap<snmalloc::PALLinux,_snmalloc::FlatPagemap<14UL,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_snmalloc::PALLinux,_false>,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_false>,_14UL>::Type<snmalloc::PagemapRegisterRange<snmalloc::DummyAuthmap>::Type<snmalloc::PagemapRegisterRange<snmalloc::BasicPagemap<snmalloc::PALLinux,_snmalloc::FlatPagemap<14UL,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_snmalloc::PALLinux,_false>,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_false>_>::Type<snmalloc::PalRange<snmalloc::PALLinux>_>_>_>_>_>_>
                           ::parent,size);
    return (Arena<void>)CVar2.unsafe_capptr;
  }
  AVar1.unsafe_capptr =
       (void *)Buddy<snmalloc::BuddyChunkRep<snmalloc::BasicPagemap<snmalloc::PALLinux,_snmalloc::FlatPagemap<14UL,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_snmalloc::PALLinux,_false>,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_false>_>,_14UL,_63UL>
               ::remove_block(&this->buddy_large,size);
  if (AVar1.unsafe_capptr != (void *)0x0) {
    return (Arena<void>)AVar1.unsafe_capptr;
  }
  AVar1 = refill(this,size);
  return (Arena<void>)AVar1.unsafe_capptr;
}

Assistant:

capptr::Arena<void> alloc_range(size_t size)
      {
        SNMALLOC_ASSERT(size >= MIN_CHUNK_SIZE);
        SNMALLOC_ASSERT(bits::is_pow2(size));

        if (size >= bits::mask_bits(MAX_SIZE_BITS))
        {
          if (ParentRange::Aligned)
            return parent.alloc_range(size);

          return nullptr;
        }

        auto result = capptr::Arena<void>::unsafe_from(
          reinterpret_cast<void*>(buddy_large.remove_block(size)));

        if (result != nullptr)
          return result;

        return refill(size);
      }